

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void sigInt(int signo)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ostream *poVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint32_t page_size;
  uint64_t data_bytes;
  uint64_t total_consumer_objects;
  uint64_t total_producer_objects;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  duration<double,std::ratio<1l,1l>> local_20 [8];
  rep_conflict local_18;
  rep_conflict total_time;
  int signo_local;
  
  total_time._4_4_ = signo;
  total_producer_objects = std::chrono::_V2::steady_clock::now();
  local_28.__r = (rep)std::chrono::operator-
                                ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&total_producer_objects,&start);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (local_20,&local_28);
  local_18 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                       ((duration<double,_std::ratio<1L,_1L>_> *)local_20);
  iVar1 = std::accumulate<unsigned_int*,int>(p,p + producer_num,0);
  uVar2 = (ulong)iVar1;
  iVar1 = std::accumulate<unsigned_int*,int>(c,c + consumer_num,0);
  uVar3 = producer_num * uVar2 * 0x400;
  lVar4 = sysconf(0x1e);
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "----------------------------------------------------------------------------------------------------------------------------"
                          );
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"producer thread num:");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,producer_num);
  poVar5 = std::operator<<(poVar5," consumer thread num: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,consumer_num);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"total_time: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18);
  poVar5 = std::operator<<(poVar5," seconds\n");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"total_producer_num: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
  poVar5 = std::operator<<(poVar5," objects\n");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"toatl_consumer_num: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(long)iVar1);
  poVar5 = std::operator<<(poVar5," objects\n");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"page_size:");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)lVar4);
  poVar5 = std::operator<<(poVar5," bytes\n");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"object_size:");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x50);
  poVar5 = std::operator<<(poVar5," bytes\n");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"total_size:");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
  poVar5 = std::operator<<(poVar5," bytes\n");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"ops:");
  lVar4 = uVar2 + (long)iVar1;
  auVar6._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar6._0_8_ = lVar4;
  auVar6._12_4_ = 0x45300000;
  poVar5 = (ostream *)
           std::ostream::operator<<
                     (poVar5,((auVar6._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) /
                             local_18);
  poVar5 = std::operator<<(poVar5," operations/second\n");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"throught:");
  auVar7._8_4_ = (int)(uVar3 >> 0x20);
  auVar7._0_8_ = uVar3;
  auVar7._12_4_ = 0x45300000;
  poVar5 = (ostream *)
           std::ostream::operator<<
                     (poVar5,((((((auVar7._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) *
                                1.0) / local_18) / 1024.0) / 1024.0) / 1024.0);
  poVar5 = std::operator<<(poVar5," G/second\n");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "----------------------------------------------------------------------------------------------------------------------------"
                          );
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  exit(0);
}

Assistant:

void sigInt(int signo){
    
    auto total_time = std::chrono::duration<double>(std::chrono::steady_clock::now() - start).count(); 
    uint64_t total_producer_objects = std::accumulate(p, p + producer_num, 0);
    uint64_t total_consumer_objects = std::accumulate(c, c + consumer_num, 0);
    uint64_t data_bytes = producer_num * total_producer_objects * sizeof(Object) * DATA_LEN;
   
    uint32_t page_size = sysconf(_SC_PAGESIZE);
    std::cout<<"----------------------------------------------------------------------------------------------------------------------------"<< std::endl; 
    std::cout<<"producer thread num:"<< producer_num <<" consumer thread num: " << consumer_num << std::endl << std::endl;
    std::cout<<"total_time: " << total_time << " seconds\n" << std::endl;
    std::cout<<"total_producer_num: " << total_producer_objects << " objects\n" << std::endl;
    std::cout<<"toatl_consumer_num: " << total_consumer_objects << " objects\n" << std::endl;
    std::cout<<"page_size:" << page_size << " bytes\n" << std::endl;
    std::cout<<"object_size:" << sizeof(Object)  + DATA_LEN << " bytes\n" << std::endl;
    std::cout<<"total_size:" << data_bytes << " bytes\n" << std::endl;
    
    std::cout<<"ops:" << (total_producer_objects + total_consumer_objects) * 1.0 / total_time << " operations/second\n" <<std::endl;
    std::cout<<"throught:" << data_bytes * 1.0 / total_time / 1024 / 1024 / 1024 << " G/second\n" << std::endl; 
    std::cout<<"----------------------------------------------------------------------------------------------------------------------------"<< std::endl; 
    exit(0);
}